

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

bool __thiscall cmSourceFileLocation::Matches(cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  cmMakefile *this_00;
  bool bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  string *psVar5;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  string *binDir_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  string *srcDir_1;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  string *binDir;
  string *local_70;
  string *srcDir;
  allocator local_51;
  string local_50;
  cmSourceFileLocation *local_30;
  cmSourceFileLocation *loc2;
  cmSourceFileLocation *loc1;
  cmSourceFileLocation *loc_local;
  cmSourceFileLocation *this_local;
  
  loc1 = loc;
  loc_local = this;
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0xd5,"bool cmSourceFileLocation::Matches(const cmSourceFileLocation &)");
  }
  if ((this->AmbiguousExtension & 1U) == (loc->AmbiguousExtension & 1U)) {
    lVar2 = std::__cxx11::string::size();
    lVar3 = std::__cxx11::string::size();
    if ((lVar2 != lVar3) ||
       (bVar1 = cmsys::SystemTools::ComparePath(&this->Name,&loc1->Name), !bVar1)) {
      this_local._7_1_ = 0;
      goto LAB_005d8ec1;
    }
  }
  else {
    local_30 = loc;
    loc2 = this;
    if ((this->AmbiguousExtension & 1U) != 0) {
      local_30 = this;
      loc2 = loc;
    }
    bVar1 = MatchesAmbiguousExtension(loc2,local_30);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_005d8ec1;
    }
  }
  if (((this->AmbiguousDirectory & 1U) == 0) && ((loc1->AmbiguousDirectory & 1U) == 0)) {
    bVar1 = std::operator!=(&this->Directory,&loc1->Directory);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_005d8ec1;
    }
  }
  else if (((this->AmbiguousDirectory & 1U) == 0) || ((loc1->AmbiguousDirectory & 1U) == 0)) {
    if ((this->AmbiguousDirectory & 1U) == 0) {
      if ((loc1->AmbiguousDirectory & 1U) == 0) goto LAB_005d8ead;
      psVar5 = &loc1->Directory;
      pcVar4 = cmMakefile::GetCurrentSourceDirectory(loc1->Makefile);
      cmsys::SystemTools::CollapseFullPath((string *)&binDir_1,psVar5,pcVar4);
      psVar5 = &loc1->Directory;
      local_c8 = (string *)&binDir_1;
      pcVar4 = cmMakefile::GetCurrentBinaryDirectory(loc1->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_110,psVar5,pcVar4);
      local_f0 = &local_110;
      bVar1 = std::operator!=(local_c8,&this->Directory);
      if ((bVar1) && (bVar1 = std::operator!=(local_f0,&this->Directory), bVar1)) {
        this_local._7_1_ = 0;
        srcDir_1._4_4_ = 1;
      }
      else {
        srcDir_1._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&binDir_1);
    }
    else {
      pcVar4 = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
      cmsys::SystemTools::CollapseFullPath((string *)&binDir,&this->Directory,pcVar4);
      local_70 = (string *)&binDir;
      pcVar4 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_b8,&this->Directory,pcVar4);
      local_98 = &local_b8;
      bVar1 = std::operator!=(local_70,&loc1->Directory);
      if ((bVar1) && (bVar1 = std::operator!=(local_98,&loc1->Directory), bVar1)) {
        this_local._7_1_ = 0;
        srcDir_1._4_4_ = 1;
      }
      else {
        srcDir_1._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&binDir);
    }
    if (srcDir_1._4_4_ != 0) goto LAB_005d8ec1;
  }
  else {
    if (this->Makefile != loc1->Makefile) {
      this_00 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_50,
                 "Matches error: Each side has a directory relative to a different location. This can occur when referencing a source file from a different directory.  This is not yet allowed."
                 ,&local_51);
      cmMakefile::IssueMessage(this_00,INTERNAL_ERROR,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      this_local._7_1_ = 0;
      goto LAB_005d8ec1;
    }
    bVar1 = std::operator!=(&this->Directory,&loc1->Directory);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_005d8ec1;
    }
  }
LAB_005d8ead:
  Update(this,loc1);
  this_local._7_1_ = 1;
LAB_005d8ec1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSourceFileLocation::Matches(cmSourceFileLocation const& loc)
{
  assert(this->Makefile);
  if(this->AmbiguousExtension == loc.AmbiguousExtension)
    {
    // Both extensions are similarly ambiguous.  Since only the old fixed set
    // of extensions will be tried, the names must match at this point to be
    // the same file.
    if(this->Name.size() != loc.Name.size() ||
      !cmSystemTools::ComparePath(this->Name, loc.Name))
      {
      return false;
      }
    }
  else
    {
    const cmSourceFileLocation* loc1;
    const cmSourceFileLocation* loc2;
    if(this->AmbiguousExtension)
      {
      // Only "this" extension is ambiguous.
      loc1 = &loc;
      loc2 = this;
      }
    else
      {
      // Only "loc" extension is ambiguous.
      loc1 = this;
      loc2 = &loc;
      }
    if(!loc1->MatchesAmbiguousExtension(*loc2))
      {
      return false;
      }
    }

  if(!this->AmbiguousDirectory && !loc.AmbiguousDirectory)
    {
    // Both sides have absolute directories.
    if(this->Directory != loc.Directory)
      {
      return false;
      }
    }
  else if(this->AmbiguousDirectory && loc.AmbiguousDirectory)
    {
    if (this->Makefile == loc.Makefile)
      {
      // Both sides have directories relative to the same location.
      if(this->Directory != loc.Directory)
        {
        return false;
        }
      }
    else
      {
      // Each side has a directory relative to a different location.
      // This can occur when referencing a source file from a different
      // directory.  This is not yet allowed.
      this->Makefile->IssueMessage(
        cmake::INTERNAL_ERROR,
        "Matches error: Each side has a directory relative to a different "
        "location. This can occur when referencing a source file from a "
        "different directory.  This is not yet allowed."
        );
      return false;
      }
    }
  else if(this->AmbiguousDirectory)
    {
    // Compare possible directory combinations.
    std::string const& srcDir =
      cmSystemTools::CollapseFullPath(
        this->Directory, this->Makefile->GetCurrentSourceDirectory());
    std::string const& binDir =
      cmSystemTools::CollapseFullPath(
        this->Directory, this->Makefile->GetCurrentBinaryDirectory());
    if(srcDir != loc.Directory &&
       binDir != loc.Directory)
      {
      return false;
      }
    }
  else if(loc.AmbiguousDirectory)
    {
    // Compare possible directory combinations.
    std::string const& srcDir =
      cmSystemTools::CollapseFullPath(
        loc.Directory, loc.Makefile->GetCurrentSourceDirectory());
    std::string const& binDir =
      cmSystemTools::CollapseFullPath(
        loc.Directory, loc.Makefile->GetCurrentBinaryDirectory());
    if(srcDir != this->Directory &&
       binDir != this->Directory)
      {
      return false;
      }
    }

  // File locations match.
  this->Update(loc);
  return true;
}